

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O0

int draco::ans_read_init(AnsDecoder *ans,uint8_t *buf,int offset)

{
  int iVar1;
  uint32_t uVar2;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  uint x;
  uint local_4;
  
  if (in_EDX < 1) {
    return 1;
  }
  *in_RDI = in_RSI;
  iVar1 = (int)(uint)*(byte *)(in_RSI + (in_EDX + -1)) >> 6;
  if (iVar1 == 0) {
    *(int *)(in_RDI + 1) = in_EDX + -1;
    *(uint *)((long)in_RDI + 0xc) = *(byte *)(in_RSI + (in_EDX + -1)) & 0x3f;
  }
  else if (iVar1 == 1) {
    if (in_EDX < 2) {
      return 1;
    }
    *(int *)(in_RDI + 1) = in_EDX + -2;
    uVar2 = mem_get_le16((void *)(in_RSI + in_EDX + -2));
    *(uint32_t *)((long)in_RDI + 0xc) = uVar2 & 0x3fff;
  }
  else {
    if (iVar1 != 2) {
      return 1;
    }
    if (in_EDX < 3) {
      return 1;
    }
    *(int *)(in_RDI + 1) = in_EDX + -3;
    uVar2 = mem_get_le24((void *)(in_RSI + in_EDX + -3));
    *(uint32_t *)((long)in_RDI + 0xc) = uVar2 & 0x3fffff;
  }
  *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) + 0x1000;
  local_4 = (uint)(0xfffff < *(uint *)((long)in_RDI + 0xc));
  return local_4;
}

Assistant:

static inline int ans_read_init(struct AnsDecoder *const ans,
                                const uint8_t *const buf, int offset) {
  unsigned x;
  if (offset < 1) {
    return 1;
  }
  ans->buf = buf;
  x = buf[offset - 1] >> 6;
  if (x == 0) {
    ans->buf_offset = offset - 1;
    ans->state = buf[offset - 1] & 0x3F;
  } else if (x == 1) {
    if (offset < 2) {
      return 1;
    }
    ans->buf_offset = offset - 2;
    ans->state = mem_get_le16(buf + offset - 2) & 0x3FFF;
  } else if (x == 2) {
    if (offset < 3) {
      return 1;
    }
    ans->buf_offset = offset - 3;
    ans->state = mem_get_le24(buf + offset - 3) & 0x3FFFFF;
  } else {
    return 1;
  }
  ans->state += DRACO_ANS_L_BASE;
  if (ans->state >= DRACO_ANS_L_BASE * DRACO_ANS_IO_BASE) {
    return 1;
  }
  return 0;
}